

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scfx_rep.cpp
# Opt level: O0

bool __thiscall sc_dt::scfx_rep::get_bit(scfx_rep *this,int i)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  word wVar4;
  scfx_rep *in_RDI;
  bool result;
  scfx_index x;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  scfx_index local_1c [3];
  bool local_1;
  
  bVar1 = is_normal(in_RDI);
  if (bVar1) {
    local_1c[0] = calc_indices(in_RDI,in_stack_ffffffffffffffd4);
    iVar2 = scfx_index::wi(local_1c);
    iVar3 = size((scfx_rep *)0x262985);
    if (iVar2 < iVar3) {
      iVar3 = scfx_index::wi(local_1c);
      if (iVar3 < 0) {
        local_1 = false;
      }
      else {
        toggle_tc((scfx_rep *)CONCAT44(iVar2,in_stack_ffffffffffffffd0));
        iVar3 = scfx_index::wi(local_1c);
        wVar4 = scfx_mant::operator[](&in_RDI->m_mant,iVar3);
        iVar3 = scfx_index::bi(local_1c);
        toggle_tc((scfx_rep *)CONCAT44(iVar2,wVar4));
        local_1 = (wVar4 & 1 << ((byte)iVar3 & 0x1f)) != 0;
      }
    }
    else {
      local_1 = is_neg(in_RDI);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
scfx_rep::get_bit( int i ) const
{
    if( ! is_normal() )
	return false;

    scfx_index x = calc_indices( i );

    if( x.wi() >= size() )
	return is_neg();

    if( x.wi() < 0 )
	return false;

    const_cast<scfx_rep*>( this )->toggle_tc();

    bool result = ( m_mant[x.wi()] & ( 1 << x.bi() ) ) != 0;

    const_cast<scfx_rep*>( this )->toggle_tc();

    return result;
}